

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O0

void __thiscall
WellFounded::addRule(WellFounded *this,BoolView *hl,vec<BoolView> *posb,vec<BoolView> *negb)

{
  vec<BoolView> *in_RCX;
  BoolView *in_RDI;
  vec<vec<BoolView>_> *in_stack_ffffffffffffffd0;
  
  vec<BoolView>::push(in_RCX,in_RDI);
  vec<vec<BoolView>_>::push(in_stack_ffffffffffffffd0);
  vec<vec<BoolView>_>::last((vec<vec<BoolView>_> *)&in_RDI[2].v);
  vec<BoolView>::copyTo(in_RCX,(vec<BoolView> *)in_RDI);
  vec<vec<BoolView>_>::push(in_stack_ffffffffffffffd0);
  vec<vec<BoolView>_>::last((vec<vec<BoolView>_> *)&in_RDI[3].v);
  vec<BoolView>::copyTo(in_RCX,(vec<BoolView> *)in_RDI);
  vec<BoolView>::push(in_RCX,in_RDI);
  return;
}

Assistant:

void addRule(const BoolView& hl, vec<BoolView>& posb, vec<BoolView>& negb) {
		raw_heads.push(hl);
		raw_posb.push();
		posb.copyTo(raw_posb.last());
		raw_negb.push();
		negb.copyTo(raw_negb.last());
		raw_bl.push(bv_false);
	}